

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

void __thiscall cmGlobalGenerator::Generate(cmGlobalGenerator *this)

{
  Snapshot snapshot;
  Snapshot snapshot_00;
  Snapshot snapshot_01;
  iterator iVar1;
  bool bVar2;
  uint uVar3;
  ulong uVar4;
  size_type sVar5;
  reference ppcVar6;
  cmMakefile *pcVar7;
  pointer ppVar8;
  pointer __k;
  mapped_type *pmVar9;
  pointer this_00;
  pointer ppVar10;
  cmake *pcVar11;
  pointer ppVar12;
  ostream *poVar13;
  reference pbVar14;
  PolicyID id;
  float local_4c8;
  PositionType local_408;
  Snapshot local_3f8;
  cmListFileBacktrace local_3e0;
  string local_3b0;
  _Self local_390;
  _Self local_388;
  iterator iter;
  undefined1 local_360 [8];
  ostringstream w;
  PositionType local_1e8;
  Snapshot local_1d8;
  cmListFileBacktrace local_1c0;
  allocator local_189;
  string local_188;
  _Self local_168;
  _Self local_160;
  iterator it_1;
  Snapshot local_148;
  cmListFileBacktrace local_130;
  allocator local_f9;
  string local_f8;
  allocator local_d1;
  string local_d0;
  undefined4 local_ac;
  __normal_iterator<std::pair<cmQtAutoGenerators,_const_cmTarget_*>_*,_std::vector<std::pair<cmQtAutoGenerators,_const_cmTarget_*>,_std::allocator<std::pair<cmQtAutoGenerators,_const_cmTarget_*>_>_>_>
  local_a8;
  __normal_iterator<std::pair<cmQtAutoGenerators,_const_cmTarget_*>_*,_std::vector<std::pair<cmQtAutoGenerators,_const_cmTarget_*>,_std::allocator<std::pair<cmQtAutoGenerators,_const_cmTarget_*>_>_>_>
  local_a0;
  iterator it;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
  local_88;
  iterator tit;
  cmTargets *targets;
  cmMakefile *mf;
  cmTargets globalTargets;
  uint i;
  undefined1 local_28 [8];
  AutogensType autogens;
  cmGlobalGenerator *this_local;
  
  autogens.
  super__Vector_base<std::pair<cmQtAutoGenerators,_const_cmTarget_*>,_std::allocator<std::pair<cmQtAutoGenerators,_const_cmTarget_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  uVar3 = (*this->_vptr_cmGlobalGenerator[0x20])();
  if ((uVar3 & 1) != 0) {
    FinalizeTargetCompileInfo(this);
    std::
    vector<std::pair<cmQtAutoGenerators,_const_cmTarget_*>,_std::allocator<std::pair<cmQtAutoGenerators,_const_cmTarget_*>_>_>
    ::vector((vector<std::pair<cmQtAutoGenerators,_const_cmTarget_*>,_std::allocator<std::pair<cmQtAutoGenerators,_const_cmTarget_*>_>_>
              *)local_28);
    CreateQtAutoGeneratorsTargets
              (this,(vector<std::pair<cmQtAutoGenerators,_const_cmTarget_*>,_std::allocator<std::pair<cmQtAutoGenerators,_const_cmTarget_*>_>_>
                     *)local_28);
    std::
    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>_>
    ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>_>
                     *)&mf);
    CreateDefaultGlobalTargets
              (this,(unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>_>
                     *)&mf);
    for (globalTargets._M_h._M_single_bucket._0_4_ = 0;
        uVar4 = (ulong)(uint)globalTargets._M_h._M_single_bucket,
        sVar5 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::size
                          (&this->LocalGenerators), uVar4 < sVar5;
        globalTargets._M_h._M_single_bucket._0_4_ = (uint)globalTargets._M_h._M_single_bucket + 1) {
      ppcVar6 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[]
                          (&this->LocalGenerators,(ulong)(uint)globalTargets._M_h._M_single_bucket);
      cmLocalGenerator::ComputeObjectMaxPath(*ppcVar6);
      ppcVar6 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[]
                          (&this->LocalGenerators,(ulong)(uint)globalTargets._M_h._M_single_bucket);
      pcVar7 = cmLocalGenerator::GetMakefile(*ppcVar6);
      tit.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
      ._M_cur = (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
                 )cmMakefile::GetTargets_abi_cxx11_(pcVar7);
      std::__detail::
      _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
      ::_Node_iterator((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
                        *)&local_88);
      local_88._M_cur =
           (__node_type *)
           std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>_>
           ::begin((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>_>
                    *)&mf);
      while( true ) {
        it._M_current =
             (pair<cmQtAutoGenerators,_const_cmTarget_*> *)
             std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>_>
             ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>_>
                    *)&mf);
        bVar2 = std::__detail::operator!=
                          (&local_88,
                           (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
                            *)&it);
        if (!bVar2) break;
        ppVar8 = std::__detail::
                 _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
                 ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
                               *)&local_88);
        iVar1 = tit;
        __k = std::__detail::
              _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
              ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
                            *)&local_88);
        pmVar9 = std::
                 unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>_>
                 ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>_>
                               *)iVar1.
                                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
                                 ._M_cur,&__k->first);
        cmTarget::operator=(pmVar9,&ppVar8->second);
        iVar1 = tit;
        ppVar8 = std::__detail::
                 _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
                 ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
                               *)&local_88);
        pmVar9 = std::
                 unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>_>
                 ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>_>
                               *)iVar1.
                                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
                                 ._M_cur,&ppVar8->first);
        cmTarget::SetMakefile(pmVar9,pcVar7);
        std::__detail::
        _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
        ::operator++((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
                      *)&local_88);
      }
    }
    for (globalTargets._M_h._M_single_bucket._0_4_ = 0;
        uVar4 = (ulong)(uint)globalTargets._M_h._M_single_bucket,
        sVar5 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::size
                          (&this->LocalGenerators), uVar4 < sVar5;
        globalTargets._M_h._M_single_bucket._0_4_ = (uint)globalTargets._M_h._M_single_bucket + 1) {
      ppcVar6 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[]
                          (&this->LocalGenerators,(ulong)(uint)globalTargets._M_h._M_single_bucket);
      (*(*ppcVar6)->_vptr_cmLocalGenerator[4])();
    }
    CreateGeneratorTargets(this);
    local_a0._M_current =
         (pair<cmQtAutoGenerators,_const_cmTarget_*> *)
         std::
         vector<std::pair<cmQtAutoGenerators,_const_cmTarget_*>,_std::allocator<std::pair<cmQtAutoGenerators,_const_cmTarget_*>_>_>
         ::begin((vector<std::pair<cmQtAutoGenerators,_const_cmTarget_*>,_std::allocator<std::pair<cmQtAutoGenerators,_const_cmTarget_*>_>_>
                  *)local_28);
    while( true ) {
      local_a8._M_current =
           (pair<cmQtAutoGenerators,_const_cmTarget_*> *)
           std::
           vector<std::pair<cmQtAutoGenerators,_const_cmTarget_*>,_std::allocator<std::pair<cmQtAutoGenerators,_const_cmTarget_*>_>_>
           ::end((vector<std::pair<cmQtAutoGenerators,_const_cmTarget_*>,_std::allocator<std::pair<cmQtAutoGenerators,_const_cmTarget_*>_>_>
                  *)local_28);
      bVar2 = __gnu_cxx::operator!=(&local_a0,&local_a8);
      if (!bVar2) break;
      this_00 = __gnu_cxx::
                __normal_iterator<std::pair<cmQtAutoGenerators,_const_cmTarget_*>_*,_std::vector<std::pair<cmQtAutoGenerators,_const_cmTarget_*>,_std::allocator<std::pair<cmQtAutoGenerators,_const_cmTarget_*>_>_>_>
                ::operator->(&local_a0);
      ppVar10 = __gnu_cxx::
                __normal_iterator<std::pair<cmQtAutoGenerators,_const_cmTarget_*>_*,_std::vector<std::pair<cmQtAutoGenerators,_const_cmTarget_*>,_std::allocator<std::pair<cmQtAutoGenerators,_const_cmTarget_*>_>_>_>
                ::operator->(&local_a0);
      cmQtAutoGenerators::SetupAutoGenerateTarget(&this_00->first,ppVar10->second);
      __gnu_cxx::
      __normal_iterator<std::pair<cmQtAutoGenerators,_const_cmTarget_*>_*,_std::vector<std::pair<cmQtAutoGenerators,_const_cmTarget_*>,_std::allocator<std::pair<cmQtAutoGenerators,_const_cmTarget_*>_>_>_>
      ::operator++(&local_a0);
    }
    for (globalTargets._M_h._M_single_bucket._0_4_ = 0;
        uVar4 = (ulong)(uint)globalTargets._M_h._M_single_bucket,
        sVar5 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::size
                          (&this->LocalGenerators), uVar4 < sVar5;
        globalTargets._M_h._M_single_bucket._0_4_ = (uint)globalTargets._M_h._M_single_bucket + 1) {
      ppcVar6 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[]
                          (&this->LocalGenerators,(ulong)(uint)globalTargets._M_h._M_single_bucket);
      cmLocalGenerator::TraceDependencies(*ppcVar6);
    }
    (*this->_vptr_cmGlobalGenerator[0x23])();
    for (globalTargets._M_h._M_single_bucket._0_4_ = 0;
        uVar4 = (ulong)(uint)globalTargets._M_h._M_single_bucket,
        sVar5 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::size
                          (&this->LocalGenerators), uVar4 < sVar5;
        globalTargets._M_h._M_single_bucket._0_4_ = (uint)globalTargets._M_h._M_single_bucket + 1) {
      ppcVar6 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[]
                          (&this->LocalGenerators,(ulong)(uint)globalTargets._M_h._M_single_bucket);
      cmLocalGenerator::GenerateTargetManifest(*ppcVar6);
    }
    ProcessEvaluationFiles(this);
    uVar3 = (*this->_vptr_cmGlobalGenerator[0x1f])();
    if ((uVar3 & 1) == 0) {
      local_ac = 1;
    }
    else {
      FillLocalGeneratorToTargetMap(this);
      for (globalTargets._M_h._M_single_bucket._0_4_ = 0;
          uVar4 = (ulong)(uint)globalTargets._M_h._M_single_bucket,
          sVar5 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::size
                            (&this->LocalGenerators), uVar4 < sVar5;
          globalTargets._M_h._M_single_bucket._0_4_ = (uint)globalTargets._M_h._M_single_bucket + 1)
      {
        ppcVar6 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[]
                            (&this->LocalGenerators,(ulong)(uint)globalTargets._M_h._M_single_bucket
                            );
        (*(*ppcVar6)->_vptr_cmLocalGenerator[3])();
      }
      for (globalTargets._M_h._M_single_bucket._0_4_ = 0;
          uVar4 = (ulong)(uint)globalTargets._M_h._M_single_bucket,
          sVar5 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::size
                            (&this->LocalGenerators), uVar4 < sVar5;
          globalTargets._M_h._M_single_bucket._0_4_ = (uint)globalTargets._M_h._M_single_bucket + 1)
      {
        ppcVar6 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[]
                            (&this->LocalGenerators,(ulong)(uint)globalTargets._M_h._M_single_bucket
                            );
        pcVar7 = cmLocalGenerator::GetMakefile(*ppcVar6);
        SetCurrentMakefile(this,pcVar7);
        ppcVar6 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[]
                            (&this->LocalGenerators,(ulong)(uint)globalTargets._M_h._M_single_bucket
                            );
        (*(*ppcVar6)->_vptr_cmLocalGenerator[2])();
        ppcVar6 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[]
                            (&this->LocalGenerators,(ulong)(uint)globalTargets._M_h._M_single_bucket
                            );
        pcVar7 = cmLocalGenerator::GetMakefile(*ppcVar6);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_d0,"CMAKE_SKIP_INSTALL_RULES",&local_d1);
        bVar2 = cmMakefile::IsOn(pcVar7,&local_d0);
        std::__cxx11::string::~string((string *)&local_d0);
        std::allocator<char>::~allocator((allocator<char> *)&local_d1);
        if (((bVar2 ^ 0xffU) & 1) != 0) {
          ppcVar6 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[]
                              (&this->LocalGenerators,
                               (ulong)(uint)globalTargets._M_h._M_single_bucket);
          cmLocalGenerator::GenerateInstallRules(*ppcVar6);
        }
        ppcVar6 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[]
                            (&this->LocalGenerators,(ulong)(uint)globalTargets._M_h._M_single_bucket
                            );
        cmLocalGenerator::GenerateTestFiles(*ppcVar6);
        pcVar11 = this->CMakeInstance;
        uVar4 = (ulong)(uint)globalTargets._M_h._M_single_bucket;
        sVar5 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::size
                          (&this->LocalGenerators);
        local_4c8 = (float)sVar5;
        cmake::UpdateProgress(pcVar11,"Generating",((float)uVar4 + 1.0) / local_4c8);
      }
      SetCurrentMakefile(this,(cmMakefile *)0x0);
      bVar2 = GenerateCPackPropertiesFile(this);
      if (!bVar2) {
        pcVar11 = GetCMakeInstance(this);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_f8,"Could not write CPack properties file.",&local_f9);
        cmLinkedTree<cmState::SnapshotDataType>::iterator::iterator((iterator *)&it_1);
        cmState::Snapshot::Snapshot(&local_148,(cmState *)0x0,_it_1);
        snapshot.Position.Tree = local_148.Position.Tree;
        snapshot.State = local_148.State;
        snapshot.Position.Position = local_148.Position.Position;
        cmListFileBacktrace::cmListFileBacktrace(&local_130,snapshot);
        cmake::IssueMessage(pcVar11,FATAL_ERROR,&local_f8,&local_130);
        cmListFileBacktrace::~cmListFileBacktrace(&local_130);
        std::__cxx11::string::~string((string *)&local_f8);
        std::allocator<char>::~allocator((allocator<char> *)&local_f9);
      }
      local_160._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportBuildFileGenerator_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportBuildFileGenerator_*>_>_>
           ::begin(&this->BuildExportSets);
      while( true ) {
        local_168._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportBuildFileGenerator_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportBuildFileGenerator_*>_>_>
             ::end(&this->BuildExportSets);
        bVar2 = std::operator!=(&local_160,&local_168);
        if (!bVar2) break;
        ppVar12 = std::
                  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportBuildFileGenerator_*>_>
                  ::operator->(&local_160);
        bVar2 = cmExportFileGenerator::GenerateImportFile
                          (&ppVar12->second->super_cmExportFileGenerator);
        if ((!bVar2) && (bVar2 = cmSystemTools::GetErrorOccuredFlag(), !bVar2)) {
          pcVar11 = GetCMakeInstance(this);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_188,"Could not write export file.",&local_189);
          cmLinkedTree<cmState::SnapshotDataType>::iterator::iterator(&local_1e8);
          cmState::Snapshot::Snapshot(&local_1d8,(cmState *)0x0,local_1e8);
          snapshot_00.Position.Tree = local_1d8.Position.Tree;
          snapshot_00.State = local_1d8.State;
          snapshot_00.Position.Position = local_1d8.Position.Position;
          cmListFileBacktrace::cmListFileBacktrace(&local_1c0,snapshot_00);
          cmake::IssueMessage(pcVar11,FATAL_ERROR,&local_188,&local_1c0);
          cmListFileBacktrace::~cmListFileBacktrace(&local_1c0);
          std::__cxx11::string::~string((string *)&local_188);
          std::allocator<char>::~allocator((allocator<char> *)&local_189);
          local_ac = 1;
          goto LAB_005f5847;
        }
        std::
        _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportBuildFileGenerator_*>_>
        ::operator++(&local_160);
      }
      CheckRuleHashes(this);
      WriteSummary(this);
      if (this->ExtraGenerator != (cmExternalMakefileProjectGenerator *)0x0) {
        (*this->ExtraGenerator->_vptr_cmExternalMakefileProjectGenerator[6])();
      }
      bVar2 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty(&this->CMP0042WarnTargets);
      if (!bVar2) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_360);
        cmPolicies::GetPolicyWarning_abi_cxx11_((string *)&iter,(cmPolicies *)0x2a,id);
        poVar13 = std::operator<<((ostream *)local_360,(string *)&iter);
        std::operator<<(poVar13,"\n");
        std::__cxx11::string::~string((string *)&iter);
        std::operator<<((ostream *)local_360,
                        "MACOSX_RPATH is not specified for the following targets:\n");
        local_388._M_node =
             (_Base_ptr)
             std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(&this->CMP0042WarnTargets);
        while( true ) {
          local_390._M_node =
               (_Base_ptr)
               std::
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end(&this->CMP0042WarnTargets);
          bVar2 = std::operator!=(&local_388,&local_390);
          if (!bVar2) break;
          poVar13 = std::operator<<((ostream *)local_360," ");
          pbVar14 = std::
                    _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator*(&local_388);
          poVar13 = std::operator<<(poVar13,(string *)pbVar14);
          std::operator<<(poVar13,"\n");
          std::
          _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator++(&local_388);
        }
        pcVar11 = GetCMakeInstance(this);
        std::__cxx11::ostringstream::str();
        cmLinkedTree<cmState::SnapshotDataType>::iterator::iterator(&local_408);
        cmState::Snapshot::Snapshot(&local_3f8,(cmState *)0x0,local_408);
        snapshot_01.Position.Tree = local_3f8.Position.Tree;
        snapshot_01.State = local_3f8.State;
        snapshot_01.Position.Position = local_3f8.Position.Position;
        cmListFileBacktrace::cmListFileBacktrace(&local_3e0,snapshot_01);
        cmake::IssueMessage(pcVar11,AUTHOR_WARNING,&local_3b0,&local_3e0);
        cmListFileBacktrace::~cmListFileBacktrace(&local_3e0);
        std::__cxx11::string::~string((string *)&local_3b0);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_360);
      }
      cmake::UpdateProgress(this->CMakeInstance,"Generating done",-1.0);
      local_ac = 0;
    }
LAB_005f5847:
    std::
    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>_>
    ::~unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>_>
                      *)&mf);
    std::
    vector<std::pair<cmQtAutoGenerators,_const_cmTarget_*>,_std::allocator<std::pair<cmQtAutoGenerators,_const_cmTarget_*>_>_>
    ::~vector((vector<std::pair<cmQtAutoGenerators,_const_cmTarget_*>,_std::allocator<std::pair<cmQtAutoGenerators,_const_cmTarget_*>_>_>
               *)local_28);
  }
  return;
}

Assistant:

void cmGlobalGenerator::Generate()
{
  // Check whether this generator is allowed to run.
  if(!this->CheckALLOW_DUPLICATE_CUSTOM_TARGETS())
    {
    return;
    }

  this->FinalizeTargetCompileInfo();

#ifdef CMAKE_BUILD_WITH_CMAKE
  // Iterate through all targets and set up automoc for those which have
  // the AUTOMOC, AUTOUIC or AUTORCC property set
  AutogensType autogens;
  this->CreateQtAutoGeneratorsTargets(autogens);
#endif

  // For each existing cmLocalGenerator
  unsigned int i;

  // Put a copy of each global target in every directory.
  cmTargets globalTargets;
  this->CreateDefaultGlobalTargets(&globalTargets);
  for (i = 0; i < this->LocalGenerators.size(); ++i)
    {
    this->LocalGenerators[i]->ComputeObjectMaxPath();
    cmMakefile* mf = this->LocalGenerators[i]->GetMakefile();
    cmTargets* targets = &(mf->GetTargets());
    cmTargets::iterator tit;
    for ( tit = globalTargets.begin(); tit != globalTargets.end(); ++ tit )
      {
      (*targets)[tit->first] = tit->second;
      (*targets)[tit->first].SetMakefile(mf);
      }
    }

  // Add generator specific helper commands
  for (i = 0; i < this->LocalGenerators.size(); ++i)
    {
    this->LocalGenerators[i]->AddHelperCommands();
    }

  // Create per-target generator information.
  this->CreateGeneratorTargets();

#ifdef CMAKE_BUILD_WITH_CMAKE
  for (AutogensType::iterator it = autogens.begin(); it != autogens.end();
       ++it)
    {
    it->first.SetupAutoGenerateTarget(it->second);
    }
#endif

  // Trace the dependencies, after that no custom commands should be added
  // because their dependencies might not be handled correctly
  for (i = 0; i < this->LocalGenerators.size(); ++i)
    {
    this->LocalGenerators[i]->TraceDependencies();
    }

  this->ForceLinkerLanguages();

  // Compute the manifest of main targets generated.
  for (i = 0; i < this->LocalGenerators.size(); ++i)
    {
    this->LocalGenerators[i]->GenerateTargetManifest();
    }

  this->ProcessEvaluationFiles();

  // Compute the inter-target dependencies.
  if(!this->ComputeTargetDepends())
    {
    return;
    }

  // Create a map from local generator to the complete set of targets
  // it builds by default.
  this->FillLocalGeneratorToTargetMap();

  for (i = 0; i < this->LocalGenerators.size(); ++i)
    {
    this->LocalGenerators[i]->ComputeHomeRelativeOutputPath();
    }

  // Generate project files
  for (i = 0; i < this->LocalGenerators.size(); ++i)
    {
    this->SetCurrentMakefile(this->LocalGenerators[i]->GetMakefile());
    this->LocalGenerators[i]->Generate();
    if(!this->LocalGenerators[i]->GetMakefile()->IsOn(
      "CMAKE_SKIP_INSTALL_RULES"))
      {
      this->LocalGenerators[i]->GenerateInstallRules();
      }
    this->LocalGenerators[i]->GenerateTestFiles();
    this->CMakeInstance->UpdateProgress("Generating",
      (static_cast<float>(i)+1.0f)/
       static_cast<float>(this->LocalGenerators.size()));
    }
  this->SetCurrentMakefile(0);

  if(!this->GenerateCPackPropertiesFile())
    {
    this->GetCMakeInstance()->IssueMessage(
      cmake::FATAL_ERROR, "Could not write CPack properties file.");
    }

  for (std::map<std::string, cmExportBuildFileGenerator*>::iterator
      it = this->BuildExportSets.begin(); it != this->BuildExportSets.end();
      ++it)
    {
    if (!it->second->GenerateImportFile()
        && !cmSystemTools::GetErrorOccuredFlag())
      {
      this->GetCMakeInstance()
          ->IssueMessage(cmake::FATAL_ERROR, "Could not write export file.");
      return;
      }
    }
  // Update rule hashes.
  this->CheckRuleHashes();

  this->WriteSummary();

  if (this->ExtraGenerator != 0)
    {
    this->ExtraGenerator->Generate();
    }

  if(!this->CMP0042WarnTargets.empty())
    {
    std::ostringstream w;
    w << cmPolicies::GetPolicyWarning(cmPolicies::CMP0042) << "\n";
    w << "MACOSX_RPATH is not specified for"
         " the following targets:\n";
    for(std::set<std::string>::iterator
      iter = this->CMP0042WarnTargets.begin();
      iter != this->CMP0042WarnTargets.end();
      ++iter)
      {
      w << " " << *iter << "\n";
      }
    this->GetCMakeInstance()->IssueMessage(cmake::AUTHOR_WARNING, w.str());
    }

  this->CMakeInstance->UpdateProgress("Generating done", -1);
}